

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O1

void __thiscall Dialog::add(Dialog *this,Widget *widget,int grid_x,int grid_y,int grid_w,int grid_h)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  widget->grid_x = grid_x;
  widget->grid_y = grid_y;
  widget->grid_w = grid_w;
  widget->grid_h = grid_h;
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)widget;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->all_widgets).super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  widget->dialog = this;
  return;
}

Assistant:

void Dialog::add(Widget & widget, int grid_x, int grid_y, int grid_w,
   int grid_h)
{
   widget.grid_x = grid_x;
   widget.grid_y = grid_y;
   widget.grid_w = grid_w;
   widget.grid_h = grid_h;

   this->all_widgets.push_back(&widget);
   widget.dialog = this;
}